

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

int valid_profile(char *profile)

{
  MOJOSHADER_glContext *pMVar1;
  int iVar2;
  char *str;
  
  pMVar1 = ctx;
  if (ctx->have_core_opengl == 0) {
    return 0;
  }
  if (profile == (char *)0x0) {
    str = "NULL profile";
  }
  else {
    iVar2 = strcmp(profile,"arb1");
    if (iVar2 == 0) {
      if (pMVar1->have_GL_ARB_vertex_program == 0) {
        str = "MOJOSHADER_PROFILE_ARB1 profile needs GL_ARB_vertex_program";
      }
      else {
        if (pMVar1->have_GL_ARB_fragment_program != 0) {
          return 1;
        }
        str = "MOJOSHADER_PROFILE_ARB1 profile needs GL_ARB_fragment_program";
      }
    }
    else {
      iVar2 = strcmp(profile,"nv2");
      if (iVar2 == 0) {
        if (pMVar1->have_GL_ARB_vertex_program == 0) {
          str = "MOJOSHADER_PROFILE_NV2 profile needs GL_ARB_vertex_program";
        }
        else if (pMVar1->have_GL_ARB_fragment_program == 0) {
          str = "MOJOSHADER_PROFILE_NV2 profile needs GL_ARB_fragment_program";
        }
        else if (pMVar1->have_GL_NV_vertex_program2_option == 0) {
          str = "MOJOSHADER_PROFILE_NV2 profile needs GL_NV_vertex_program2_option";
        }
        else {
          if (pMVar1->have_GL_NV_fragment_program2 != 0) {
            return 1;
          }
          str = "MOJOSHADER_PROFILE_NV2 profile needs GL_NV_fragment_program2";
        }
      }
      else {
        iVar2 = strcmp(profile,"nv3");
        if (iVar2 == 0) {
          if (pMVar1->have_GL_ARB_vertex_program == 0) {
            str = "MOJOSHADER_PROFILE_NV3 profile needs GL_ARB_vertex_program";
          }
          else if (pMVar1->have_GL_ARB_fragment_program == 0) {
            str = "MOJOSHADER_PROFILE_NV3 profile needs GL_ARB_fragment_program";
          }
          else if (pMVar1->have_GL_NV_vertex_program3 == 0) {
            str = "MOJOSHADER_PROFILE_NV3 profile needs GL_NV_vertex_program3";
          }
          else {
            if (pMVar1->have_GL_NV_fragment_program2 != 0) {
              return 1;
            }
            str = "MOJOSHADER_PROFILE_NV3 profile needs GL_NV_fragment_program2";
          }
        }
        else {
          iVar2 = strcmp(profile,"nv4");
          if (iVar2 == 0) {
            if (pMVar1->have_GL_NV_gpu_program4 != 0) {
              return 1;
            }
            str = "MOJOSHADER_PROFILE_NV4 profile needs GL_NV_gpu_program4";
          }
          else {
            iVar2 = strcmp(profile,"glsles");
            if (iVar2 == 0) {
              if (0xffff < (int)((uint)(ushort)pMVar1->glsl_minor | pMVar1->glsl_major << 0x10)) {
                return 1;
              }
              str = "MOJOSHADER_PROFILE_GLSLES profile needs missing GLSL support";
            }
            else {
              iVar2 = strcmp(profile,"glsl120");
              if (iVar2 == 0) {
                if (0x10013 < (int)((uint)(ushort)pMVar1->glsl_minor | pMVar1->glsl_major << 0x10))
                {
                  return 1;
                }
                str = "MOJOSHADER_PROFILE_GLSL120 profile needs missing GLSL support";
              }
              else {
                iVar2 = strcmp(profile,"glsl");
                if (iVar2 == 0) {
                  if (0x10009 < (int)((uint)(ushort)pMVar1->glsl_minor | pMVar1->glsl_major << 0x10)
                     ) {
                    return 1;
                  }
                  str = "MOJOSHADER_PROFILE_GLSL profile needs missing GLSL support";
                }
                else {
                  str = "unknown or unsupported profile";
                }
              }
            }
          }
        }
      }
    }
  }
  set_error(str);
  return 0;
}

Assistant:

static int valid_profile(const char *profile)
{
    if (!ctx->have_core_opengl)
        return 0;

    #define MUST_HAVE(p, x) \
        if (!ctx->have_##x) { set_error(#p " profile needs " #x); return 0; }

    // we might actually _have_ maj.min, but forcibly disabled GLSL elsewhere.
    #define MUST_HAVE_GLSL(p, maj, min) \
        if (!glsl_version_atleast(maj, min)) { \
            set_error(#p " profile needs missing GLSL support"); return 0; \
        }

    if (profile == NULL)
    {
        set_error("NULL profile");
        return 0;
    } // if

    #if SUPPORT_PROFILE_ARB1
    else if (strcmp(profile, MOJOSHADER_PROFILE_ARB1) == 0)
    {
        MUST_HAVE(MOJOSHADER_PROFILE_ARB1, GL_ARB_vertex_program);
        MUST_HAVE(MOJOSHADER_PROFILE_ARB1, GL_ARB_fragment_program);
    } // else if
    #endif

    #if SUPPORT_PROFILE_ARB1_NV
    else if (strcmp(profile, MOJOSHADER_PROFILE_NV2) == 0)
    {
        MUST_HAVE(MOJOSHADER_PROFILE_NV2, GL_ARB_vertex_program);
        MUST_HAVE(MOJOSHADER_PROFILE_NV2, GL_ARB_fragment_program);
        MUST_HAVE(MOJOSHADER_PROFILE_NV2, GL_NV_vertex_program2_option);
        MUST_HAVE(MOJOSHADER_PROFILE_NV2, GL_NV_fragment_program2);
    } // else if

    else if (strcmp(profile, MOJOSHADER_PROFILE_NV3) == 0)
    {
        MUST_HAVE(MOJOSHADER_PROFILE_NV3, GL_ARB_vertex_program);
        MUST_HAVE(MOJOSHADER_PROFILE_NV3, GL_ARB_fragment_program);
        MUST_HAVE(MOJOSHADER_PROFILE_NV3, GL_NV_vertex_program3);
        MUST_HAVE(MOJOSHADER_PROFILE_NV3, GL_NV_fragment_program2);
    } // else if

    else if (strcmp(profile, MOJOSHADER_PROFILE_NV4) == 0)
    {
        MUST_HAVE(MOJOSHADER_PROFILE_NV4, GL_NV_gpu_program4);
    } // else if
    #endif

    #if SUPPORT_PROFILE_GLSLES
    else if (strcmp(profile, MOJOSHADER_PROFILE_GLSLES) == 0)
    {
        MUST_HAVE_GLSL(MOJOSHADER_PROFILE_GLSLES, 1, 00);
    } // else if
    #endif

    #if SUPPORT_PROFILE_GLSL120
    else if (strcmp(profile, MOJOSHADER_PROFILE_GLSL120) == 0)
    {
        MUST_HAVE_GLSL(MOJOSHADER_PROFILE_GLSL120, 1, 20);
    } // else if
    #endif

    #if SUPPORT_PROFILE_GLSL
    else if (strcmp(profile, MOJOSHADER_PROFILE_GLSL) == 0)
    {
        MUST_HAVE_GLSL(MOJOSHADER_PROFILE_GLSL, 1, 10);
    } // else if
    #endif

    else
    {
        set_error("unknown or unsupported profile");
        return 0;
    } // else

    #undef MUST_HAVE

    return 1;
}